

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
          (SmallVectorImpl<llvm::StringRef> *this,char (*Args) [22])

{
  size_t sVar1;
  size_t sVar2;
  iterator this_00;
  reference pSVar3;
  char (*Args_local) [22];
  SmallVectorImpl<llvm::StringRef> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,0);
  }
  this_00 = SmallVectorTemplateCommon<llvm::StringRef,_void>::end
                      ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)this);
  StringRef::StringRef(this_00,*Args);
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  pSVar3 = SmallVectorTemplateCommon<llvm::StringRef,_void>::back
                     ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)this);
  return pSVar3;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }